

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<kj::StringPtr&,kj::StringPtr&,kj::StringPtr&,char,kj::StringPtr&,char>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,StringPtr *params_1,
          StringPtr *params_2,char *params_3,StringPtr *params_4,char *params_5)

{
  undefined6 in_stack_ffffffffffffffb0;
  FixedArray<char,_1UL> local_48 [8];
  long local_40;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> local_28;
  undefined8 local_18;
  long local_10;
  
  local_18 = *(undefined8 *)this;
  local_10 = *(long *)(this + 8) + -1;
  local_28.ptr = (params->content).ptr;
  local_28.size_ = (params->content).size_ - 1;
  local_38.ptr = (params_1->content).ptr;
  local_38.size_ = (params_1->content).size_ - 1;
  local_48 = *(FixedArray<char,_1UL> (*) [8])params_3;
  local_40 = *(long *)(params_3 + 8) + -1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_18,&local_28,&local_38,
             (ArrayPtr<const_char> *)&stack0xffffffffffffffb7,local_48,
             (ArrayPtr<const_char> *)&stack0xffffffffffffffb6,
             (FixedArray<char,_1UL> *)
             CONCAT17(*(undefined1 *)&(params_2->content).ptr,
                      CONCAT16(*(undefined1 *)&(params_4->content).ptr,in_stack_ffffffffffffffb0)));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}